

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O2

void duckdb::ApproxTopKOperation::Destroy<duckdb::ApproxTopKState>
               (ApproxTopKState *state,AggregateInputData *aggr_input_data)

{
  InternalApproxTopKState *this;
  
  this = state->state;
  if (this != (InternalApproxTopKState *)0x0) {
    InternalApproxTopKState::~InternalApproxTopKState(this);
  }
  operator_delete(this);
  return;
}

Assistant:

static void Destroy(STATE &state, AggregateInputData &aggr_input_data) {
		delete state.state;
	}